

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encryption.cc
# Opt level: O3

fdb_status
fdb_encrypt_blocks(encryptor *e,void *dst_buf,void *src_buf,size_t blocksize,uint num_blocks,
                  bid_t start_bid)

{
  fdb_status fVar1;
  ulong uVar2;
  
  if (num_blocks != 0) {
    uVar2 = (ulong)num_blocks;
    do {
      fVar1 = (*e->ops->crypt)(e,true,dst_buf,src_buf,blocksize,start_bid);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        return fVar1;
      }
      src_buf = (void *)((long)src_buf + blocksize);
      dst_buf = (void *)((long)dst_buf + blocksize);
      start_bid = start_bid + 1;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  return FDB_RESULT_SUCCESS;
}

Assistant:

fdb_status fdb_encrypt_blocks(encryptor *e,
                              void *dst_buf,
                              const void *src_buf,
                              size_t blocksize,
                              unsigned num_blocks,
                              bid_t start_bid)
{
#ifdef FDB_LOG_CRYPTO
    fprintf(stderr, "CRYPT: Encrypting blocks #%llu-%llu with key %d:%llx\n",
            start_bid, start_bid+num_blocks-1,
            e->key.algorithm, *(uint64_t*)e->key.bytes);
#endif
    fdb_status status = FDB_RESULT_SUCCESS;
    for (unsigned i = 0; i < num_blocks; i++) {
        status = e->ops->crypt(e,
                               true,
                               (uint8_t*)dst_buf + i*blocksize,
                               (const uint8_t*)src_buf + i*blocksize,
                               blocksize,
                               start_bid + i);
        if (status != FDB_RESULT_SUCCESS)
            break;
    }
    return status;
}